

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void wabt::MemcpyEndianAware
               (void *dst,void *src,size_t dsize,size_t ssize,size_t doff,size_t soff,size_t len)

{
  size_t soff_local;
  size_t doff_local;
  size_t ssize_local;
  size_t dsize_local;
  void *src_local;
  void *dst_local;
  
  memcpy((void *)((long)dst + doff),(void *)((long)src + soff),len);
  return;
}

Assistant:

inline void MemcpyEndianAware(void* dst,
                              const void* src,
                              size_t dsize,
                              size_t ssize,
                              size_t doff,
                              size_t soff,
                              size_t len) {
#if WABT_BIG_ENDIAN
  memcpy(static_cast<char*>(dst) + (dsize) - (len) - (doff),
         static_cast<const char*>(src) + (ssize) - (len) - (soff), (len));
#else
  memcpy(static_cast<char*>(dst) + (doff),
         static_cast<const char*>(src) + (soff), (len));
#endif
}